

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeStructResultType(Builder *this,Id type0,Id type1)

{
  Instruction *this_00;
  int iVar1;
  Id IVar2;
  size_type sVar3;
  reference ppIVar4;
  undefined1 local_48 [8];
  Vector<spv::Id> members;
  int t;
  Instruction *type;
  Id type1_local;
  Id type0_local;
  Builder *this_local;
  
  members.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  type._0_4_ = type1;
  type._4_4_ = type0;
  _type1_local = this;
  while( true ) {
    iVar1 = members.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    sVar3 = std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
            size(this->groupedTypes + 0x1e);
    if ((int)sVar3 <= iVar1) {
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_48);
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_48,
                 (value_type_conflict1 *)((long)&type + 4));
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_48,
                 (value_type_conflict1 *)&type);
      this_local._4_4_ = makeStructType(this,(Vector<Id> *)local_48,"ResType");
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_48);
      return this_local._4_4_;
    }
    ppIVar4 = std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
              operator[](this->groupedTypes + 0x1e,
                         (long)members.
                               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    this_00 = *ppIVar4;
    iVar1 = Instruction::getNumOperands(this_00);
    if (((iVar1 == 2) && (IVar2 = Instruction::getIdOperand(this_00,0), IVar2 == type._4_4_)) &&
       (IVar2 = Instruction::getIdOperand(this_00,1), IVar2 == (Id)type)) break;
    members.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         members.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  IVar2 = Instruction::getResultId(this_00);
  return IVar2;
}

Assistant:

Id Builder::makeStructResultType(Id type0, Id type1)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeStruct].size(); ++t) {
        type = groupedTypes[OpTypeStruct][t];
        if (type->getNumOperands() != 2)
            continue;
        if (type->getIdOperand(0) != type0 ||
            type->getIdOperand(1) != type1)
            continue;
        return type->getResultId();
    }

    // not found, make it
    dxil_spv::Vector<spv::Id> members;
    members.push_back(type0);
    members.push_back(type1);

    return makeStructType(members, "ResType");
}